

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O2

ScalarFunction * duckdb::GetBitFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe8c;
  FunctionNullHandling in_stack_fffffffffffffe98;
  bind_lambda_function_t in_stack_fffffffffffffea0;
  code *local_158 [2];
  code *local_148;
  code *local_140;
  LogicalType local_138;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_120;
  LogicalType local_108;
  LogicalType local_f0 [2];
  BaseScalarFunction local_c0;
  
  LogicalType::LogicalType(local_f0,BIT);
  LogicalType::LogicalType(local_f0 + 1,INTEGER);
  __l._M_len = 2;
  __l._M_array = local_f0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_120,__l,(allocator_type *)&stack0xfffffffffffffea7);
  LogicalType::LogicalType(&local_138,INTEGER);
  local_158[1] = (code *)0x0;
  local_158[0] = ScalarFunction::BinaryFunction<duckdb::string_t,int,int,duckdb::GetBitOperator>;
  local_140 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_148 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  LogicalType::LogicalType(&local_108,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_108;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffe84;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffe8c;
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_120,&local_138,
             (scalar_function_t *)local_158,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffe98,in_stack_fffffffffffffea0);
  LogicalType::~LogicalType(&local_108);
  ::std::_Function_base::~_Function_base((_Function_base *)local_158);
  LogicalType::~LogicalType(&local_138);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_120);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_f0[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  BaseScalarFunction::SetReturnsError(&local_c0,&in_RDI->super_BaseScalarFunction);
  BaseScalarFunction::~BaseScalarFunction(&local_c0);
  return in_RDI;
}

Assistant:

ScalarFunction GetBitFun::GetFunction() {
	ScalarFunction func({LogicalType::BIT, LogicalType::INTEGER}, LogicalType::INTEGER,
	                    ScalarFunction::BinaryFunction<string_t, int32_t, int32_t, GetBitOperator>);
	BaseScalarFunction::SetReturnsError(func);
	return func;
}